

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void get_mac(byte *buffer,int nbits,byte *out)

{
  uint uVar1;
  byte local_2c;
  int i;
  int mask;
  int rembits;
  int nbytes;
  byte *out_local;
  int nbits_local;
  byte *buffer_local;
  
  uVar1 = nbits & 7;
  if (uVar1 == 0) {
    local_2c = 0;
  }
  else {
    local_2c = (1 < uVar1) - 1;
  }
  for (i = 0; i < nbits >> 3; i = i + 1) {
    out[i] = buffer[i];
  }
  if (uVar1 != 0) {
    out[i] = buffer[i] & local_2c;
  }
  return;
}

Assistant:

void get_mac(byte * buffer, int nbits, byte * out)
{
    int nbytes = nbits >> 3;
    int rembits = nbits & 7;
    int mask = rembits ? ((1 < rembits) - 1) : 0;
    int i;
    for (i = 0; i < nbytes; i++)
        out[i] = buffer[i];
    if (rembits)
        out[i] = buffer[i] & mask;
}